

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testDeserializeHeartbeat(int count)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  string string;
  Heartbeat message;
  
  FIX42::Heartbeat::Heartbeat(&message);
  FIX::Message::toString_abi_cxx11_((int)&string,(int)&message,8);
  lVar1 = GetTickCount();
  if (count < 1) {
    count = 0;
  }
  while (bVar3 = count != 0, count = count + -1, bVar3) {
    FIX::Message::setString
              ((Message *)&message,&string,false,
               (DataDictionary *)
               s_dataDictionary._M_t.
               super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
               ._M_t.
               super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
               .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&string);
  FIX::Message::~Message((Message *)&message);
  return lVar2 - lVar1;
}

Assistant:

long testDeserializeHeartbeat(int count) {
  FIX42::Heartbeat message;
  std::string string = message.toString();
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.setString(string, DONT_VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}